

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::ECCurveTest_GPlusMinusG_Test::~ECCurveTest_GPlusMinusG_Test
          (ECCurveTest_GPlusMinusG_Test *this)

{
  anon_unknown.dwarf_4495f9::ECCurveTest_GPlusMinusG_Test::~ECCurveTest_GPlusMinusG_Test
            ((ECCurveTest_GPlusMinusG_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(ECCurveTest, GPlusMinusG) {
  const EC_POINT *g = EC_GROUP_get0_generator(group());

  bssl::UniquePtr<EC_POINT> p(EC_POINT_dup(g, group()));
  ASSERT_TRUE(p);
  ASSERT_TRUE(EC_POINT_invert(group(), p.get(), nullptr));

  bssl::UniquePtr<EC_POINT> sum(EC_POINT_new(group()));
  ASSERT_TRUE(sum);
  ASSERT_TRUE(EC_POINT_add(group(), sum.get(), g, p.get(), nullptr));
  EXPECT_TRUE(EC_POINT_is_at_infinity(group(), sum.get()));
}